

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O3

Func * __thiscall
JsUtil::List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
RemoveAtEnd(List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *this)

{
  Type pFVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *ppFVar5;
  int iVar6;
  
  iVar6 = (this->super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>).count;
  if (iVar6 < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/List.h"
                       ,0x1d2,"(this->count >= 1)","this->count >= 1");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    iVar6 = (this->super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>).count;
  }
  ppFVar5 = Item(this,iVar6 + -1);
  pFVar1 = *ppFVar5;
  Js::
  CopyRemovePolicy<JsUtil::List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
  ::RemoveAt((CopyRemovePolicy<JsUtil::List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
              *)&this->field_0x28,this,
             (this->super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>).count +
             -1);
  return pFVar1;
}

Assistant:

T RemoveAtEnd()
        {
            Assert(this->count >= 1);
            T item = this->Item(this->count - 1);
            RemoveAt(this->count - 1);
            return item;
        }